

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable.hpp
# Opt level: O2

flat_hash_set<cs_impl::any,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<cs_impl::any>_>
* __thiscall
cs_impl::any::
val<phmap::flat_hash_set<cs_impl::any,phmap::Hash<cs_impl::any>,phmap::EqualTo<cs_impl::any>,std::allocator<cs_impl::any>>>
          (any *this)

{
  proxy *ppVar1;
  bool bVar2;
  type_info *__arg;
  error *peVar3;
  allocator local_31;
  string local_30;
  
  __arg = type(this);
  bVar2 = std::type_info::operator!=
                    ((type_info *)
                     &phmap::
                      flat_hash_set<cs_impl::any,phmap::Hash<cs_impl::any>,phmap::EqualTo<cs_impl::any>,std::allocator<cs_impl::any>>
                      ::typeinfo,__arg);
  if (bVar2) {
    peVar3 = (error *)__cxa_allocate_exception(0x28);
    std::__cxx11::string::string((string *)&local_30,"E0006",&local_31);
    cov::error::error(peVar3,&local_30);
    __cxa_throw(peVar3,&cov::error::typeinfo,cov::error::~error);
  }
  ppVar1 = this->mDat;
  if (ppVar1 != (proxy *)0x0) {
    if (ppVar1->protect_level < 2) {
      return (flat_hash_set<cs_impl::any,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<cs_impl::any>_>
              *)(ppVar1->data + 1);
    }
    peVar3 = (error *)__cxa_allocate_exception(0x28);
    std::__cxx11::string::string((string *)&local_30,"E000K",&local_31);
    cov::error::error(peVar3,&local_30);
    __cxa_throw(peVar3,&cov::error::typeinfo,cov::error::~error);
  }
  peVar3 = (error *)__cxa_allocate_exception(0x28);
  std::__cxx11::string::string((string *)&local_30,"E0005",&local_31);
  cov::error::error(peVar3,&local_30);
  __cxa_throw(peVar3,&cov::error::typeinfo,cov::error::~error);
}

Assistant:

T &val() const
		{
			if (typeid(T) != this->type())
				throw cov::error("E0006");
			if (this->mDat == nullptr)
				throw cov::error("E0005");
			if (this->mDat->protect_level > 1)
				throw cov::error("E000K");
			return static_cast<holder<T> *>(this->mDat->data)->data();
		}